

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

ImageChannelValues * __thiscall
pbrt::Image::MSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                Image *ref,Image *mseImage)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar1;
  size_t sVar2;
  float fVar3;
  Allocator alloc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ulong uVar6;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar7;
  int c;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  Point2i PVar12;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D local_158;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  WrapMode2D local_120;
  vector<double,_std::allocator<double>_> sumSE;
  ColorEncodingHandle local_100;
  Point2i va;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [4];
  ImageChannelDesc refDesc;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumSE,(desc->offset).nStored,(value_type_conflict4 *)&va,(allocator_type *)&refDesc);
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n = (long)local_f0 - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    ChannelNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va,this,desc);
    ErrorExit<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ("Channels not found in image: %s",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&va);
  }
  TVar11 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar11;
  if (TVar11 == vb.super_Tuple2<pbrt::Point2,_int>) {
    if (mseImage != (Image *)0x0) {
      ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&vb,this);
      PVar12.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_100.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar10 = (long)local_148 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar10 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar12.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar11,channels,&local_100,alloc);
      operator=(mseImage,(Image *)&va);
      ~Image((Image *)&va);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar11 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    }
    for (lVar10 = 0; lVar10 < (long)TVar11 >> 0x20; lVar10 = lVar10 + 1) {
      for (uVar6 = 0; (long)uVar6 < (long)TVar11.x; uVar6 = uVar6 + 1) {
        WrapMode2D::WrapMode2D(&local_120,Clamp);
        PVar12.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(lVar10 << 0x20 | uVar6)
        ;
        GetChannels((ImageChannelValues *)&va,this,PVar12,desc,local_120);
        WrapMode2D::WrapMode2D(&local_158,Clamp);
        GetChannels((ImageChannelValues *)&vb,ref,PVar12,&refDesc,local_158);
        for (uVar8 = 0; uVar8 < (desc->offset).nStored; uVar8 = uVar8 + 1) {
          pbVar4 = local_f0;
          if (local_f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar4 = local_e8;
          }
          pbVar5 = local_148;
          if (local_148 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pbVar5 = &local_140;
          }
          fVar3 = *(float *)((long)&(pbVar4->_M_dataplus)._M_p + uVar8 * 4) -
                  *(float *)((long)&(pbVar5->_M_dataplus)._M_p + uVar8 * 4);
          fVar3 = fVar3 * fVar3;
          if (ABS(fVar3) != INFINITY) {
            sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] =
                 (double)fVar3 +
                 sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
            if (mseImage != (Image *)0x0) {
              SetChannel(mseImage,PVar12,(int)uVar8,fVar3);
            }
          }
        }
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&vb);
        InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&va);
        TVar11 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      }
    }
    ImageChannelValues::ImageChannelValues(__return_storage_ptr__,(desc->offset).nStored,0.0);
    paVar1 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
              *)(__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
    sVar2 = (desc->offset).nStored;
    paVar7 = &(__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
    if (paVar1 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                   *)0x0) {
      paVar7 = paVar1;
    }
    for (sVar9 = 0; sVar2 != sVar9; sVar9 = sVar9 + 1) {
      TVar11 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      paVar7->fixed[sVar9] =
           (float)(sumSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar9] / (double)(TVar11.y * TVar11.x));
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&refDesc.offset);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&sumSE.super__Vector_base<double,_std::allocator<double>_>);
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
             ,0x223,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x3e1641,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x3e1641,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MSE(const ImageChannelDesc &desc, const Image &ref,
                              Image *mseImage) const {
    std::vector<double> sumSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    if (!refDesc)
        ErrorExit("Channels not found in image: %s", ChannelNames(desc));

    CHECK_EQ(Resolution(), ref.Resolution());

    if (mseImage)
        *mseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float se = Sqr(v[c] - vref[c]);
                if (std::isinf(se))
                    continue;
                sumSE[c] += se;
                if (mseImage)
                    mseImage->SetChannel({x, y}, c, se);
            }
        }

    ImageChannelValues mse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mse[c] = sumSE[c] / (Resolution().x * Resolution().y);
    return mse;
}